

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O3

void __thiscall
QCborStreamReaderPrivate::QCborStreamReaderPrivate(QCborStreamReaderPrivate *this,QByteArray *data)

{
  Data *pDVar1;
  
  this->device = (QIODevice *)0x0;
  pDVar1 = (data->d).d;
  (this->buffer).d.d = pDVar1;
  (this->buffer).d.ptr = (data->d).ptr;
  (this->buffer).d.size = (data->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (this->containerStack).super_QList<CborValue>.d.d = (Data *)0x0;
  (this->containerStack).super_QList<CborValue>.d.ptr = (CborValue *)0x0;
  (this->containerStack).super_QList<CborValue>.d.size = 0;
  (this->lastError).c = NoError;
  this->bufferStart = 0;
  this->corrupt = false;
  initDecoder(this);
  return;
}

Assistant:

QCborStreamReaderPrivate(const QByteArray &data)
        : device(nullptr), buffer(data)
    {
        initDecoder();
    }